

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1502.c
# Opt level: O1

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int *piVar9;
  char *pcVar10;
  timeval tVar11;
  int still_running;
  int maxfd;
  timeval timeout;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  char redirect [160];
  int local_278;
  int local_274;
  undefined8 local_270;
  timeval local_268;
  fd_set local_258;
  fd_set local_1d8;
  fd_set local_158;
  undefined1 local_d8 [168];
  
  curl_msnprintf(local_d8,0xa0,"google.com:%s:%s",libtest_arg2,libtest_arg3);
  tv_test_start = tutil_tvnow();
  lVar4 = curl_slist_append(0,local_d8);
  if (lVar4 == 0) {
    curl_mfprintf(_stderr,"curl_slist_append() failed\n");
    iVar3 = 0x7e;
    goto LAB_001024ba;
  }
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  iVar3 = 0;
  if (iVar2 != 0) {
    uVar5 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1502.c"
                  ,0x40,iVar2,uVar5);
    iVar3 = iVar2;
  }
  if (iVar3 == 0) {
    lVar6 = curl_easy_init();
    iVar3 = 0;
    if (lVar6 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1502.c"
                    ,0x46);
      iVar3 = 0x7c;
    }
    if (lVar6 == 0) {
LAB_0010248f:
      lVar8 = 0;
      lVar7 = lVar6;
    }
    else {
      iVar2 = curl_easy_setopt(lVar6,0x2712,URL);
      uVar1 = _stderr;
      iVar3 = 0;
      if (iVar2 != 0) {
        uVar5 = curl_easy_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1502.c"
                      ,0x48,iVar2,uVar5);
        iVar3 = iVar2;
      }
      if (iVar3 != 0) goto LAB_0010248f;
      iVar2 = curl_easy_setopt(lVar6,0x2a,1);
      uVar1 = _stderr;
      iVar3 = 0;
      if (iVar2 != 0) {
        uVar5 = curl_easy_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1502.c"
                      ,0x49,iVar2,uVar5);
        iVar3 = iVar2;
      }
      if (iVar3 != 0) goto LAB_0010248f;
      iVar2 = curl_easy_setopt(lVar6,0x27db,lVar4);
      uVar1 = _stderr;
      iVar3 = 0;
      if (iVar2 != 0) {
        uVar5 = curl_easy_strerror(iVar2);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1502.c"
                      ,0x4a,iVar2,uVar5);
        iVar3 = iVar2;
      }
      if (iVar3 != 0) goto LAB_0010248f;
      lVar7 = curl_easy_duphandle(lVar6);
      if (lVar7 == 0) {
        curl_slist_free_all(lVar4);
        curl_easy_cleanup(lVar6);
        iVar3 = 0x1b;
        goto LAB_001024ba;
      }
      curl_easy_cleanup(lVar6);
      lVar8 = curl_multi_init();
      if (lVar8 == 0) {
        curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1502.c"
                      ,0x57);
        iVar3 = 0x7b;
      }
      else {
        iVar3 = curl_multi_add_handle(lVar8,lVar7);
        uVar1 = _stderr;
        if (iVar3 == 0) {
          iVar3 = 0;
        }
        else {
          uVar5 = curl_multi_strerror(iVar3);
          curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1502.c"
                        ,0x59,iVar3,uVar5);
        }
        if (iVar3 == 0) {
          iVar3 = curl_multi_perform(lVar8,&local_278);
          uVar1 = _stderr;
          if (iVar3 == 0) {
            iVar3 = 0;
            if (local_278 < 0) {
              curl_mfprintf(_stderr,
                            "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1502.c"
                            ,0x5b);
              iVar3 = 0x7a;
            }
          }
          else {
            uVar5 = curl_multi_strerror(iVar3);
            curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1502.c"
                          ,0x5b,iVar3,uVar5);
          }
          if (iVar3 == 0) {
            tVar11 = tutil_tvnow();
            lVar6 = tutil_tvdiff(tVar11,tv_test_start);
            iVar3 = 0;
            if (lVar6 < 0xea61) {
              if (local_278 != 0) {
                iVar3 = 0;
                do {
                  local_274 = -99;
                  local_158.__fds_bits[0] = 0;
                  local_158.__fds_bits[1] = 0;
                  local_158.__fds_bits[2] = 0;
                  local_158.__fds_bits[3] = 0;
                  local_158.__fds_bits[4] = 0;
                  local_158.__fds_bits[5] = 0;
                  local_158.__fds_bits[6] = 0;
                  local_158.__fds_bits[7] = 0;
                  local_158.__fds_bits[8] = 0;
                  local_158.__fds_bits[9] = 0;
                  local_158.__fds_bits[10] = 0;
                  local_158.__fds_bits[0xb] = 0;
                  local_158.__fds_bits[0xc] = 0;
                  local_158.__fds_bits[0xd] = 0;
                  local_158.__fds_bits[0xe] = 0;
                  local_158.__fds_bits[0xf] = 0;
                  local_1d8.__fds_bits[0] = 0;
                  local_1d8.__fds_bits[1] = 0;
                  local_1d8.__fds_bits[2] = 0;
                  local_1d8.__fds_bits[3] = 0;
                  local_1d8.__fds_bits[4] = 0;
                  local_1d8.__fds_bits[5] = 0;
                  local_1d8.__fds_bits[6] = 0;
                  local_1d8.__fds_bits[7] = 0;
                  local_1d8.__fds_bits[8] = 0;
                  local_1d8.__fds_bits[9] = 0;
                  local_1d8.__fds_bits[10] = 0;
                  local_1d8.__fds_bits[0xb] = 0;
                  local_1d8.__fds_bits[0xc] = 0;
                  local_1d8.__fds_bits[0xd] = 0;
                  local_1d8.__fds_bits[0xe] = 0;
                  local_1d8.__fds_bits[0xf] = 0;
                  local_258.__fds_bits[0xe] = 0;
                  local_258.__fds_bits[0xf] = 0;
                  local_258.__fds_bits[0xc] = 0;
                  local_258.__fds_bits[0xd] = 0;
                  local_258.__fds_bits[10] = 0;
                  local_258.__fds_bits[0xb] = 0;
                  local_258.__fds_bits[8] = 0;
                  local_258.__fds_bits[9] = 0;
                  local_258.__fds_bits[6] = 0;
                  local_258.__fds_bits[7] = 0;
                  local_258.__fds_bits[4] = 0;
                  local_258.__fds_bits[5] = 0;
                  local_258.__fds_bits[2] = 0;
                  local_258.__fds_bits[3] = 0;
                  local_258.__fds_bits[0] = 0;
                  local_258.__fds_bits[1] = 0;
                  local_268.tv_sec = 1;
                  local_268.tv_usec = 0;
                  iVar2 = curl_multi_fdset(lVar8,&local_158,&local_1d8,&local_258,&local_274);
                  uVar1 = _stderr;
                  if (iVar2 == 0) {
                    if (local_274 < -1) {
                      curl_mfprintf(_stderr,
                                    "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1502.c"
                                    ,0x6c);
                      iVar3 = 0x7a;
                    }
                  }
                  else {
                    uVar5 = curl_multi_strerror(iVar2);
                    curl_mfprintf(uVar1,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1502.c"
                                  ,0x6c,iVar2,uVar5);
                    iVar3 = iVar2;
                  }
                  iVar2 = 10;
                  if (iVar3 == 0) {
                    iVar3 = select_wrapper(local_274 + 1,&local_158,&local_1d8,&local_258,&local_268
                                          );
                    if (iVar3 == -1) {
                      piVar9 = __errno_location();
                      iVar3 = *piVar9;
                      local_270 = _stderr;
                      pcVar10 = strerror(iVar3);
                      curl_mfprintf(local_270,"%s:%d select() failed, with errno %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1502.c"
                                    ,0x70,iVar3,pcVar10);
                      iVar3 = 0x79;
                    }
                    else {
                      tVar11 = tutil_tvnow();
                      lVar6 = tutil_tvdiff(tVar11,tv_test_start);
                      if (lVar6 < 0xea61) {
                        iVar3 = curl_multi_perform(lVar8,&local_278);
                        uVar1 = _stderr;
                        if (iVar3 == 0) {
                          iVar3 = 0;
                          if (local_278 < 0) {
                            curl_mfprintf(_stderr,
                                          "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1502.c"
                                          ,0x74);
                            iVar3 = 0x7a;
                          }
                        }
                        else {
                          uVar5 = curl_multi_strerror(iVar3);
                          curl_mfprintf(uVar1,
                                        "%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1502.c"
                                        ,0x74,iVar3,uVar5);
                        }
                        if (iVar3 == 0) {
                          tVar11 = tutil_tvnow();
                          lVar6 = tutil_tvdiff(tVar11,tv_test_start);
                          iVar2 = 0;
                          iVar3 = 0;
                          if (60000 < lVar6) {
                            curl_mfprintf(_stderr,
                                          "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1502.c"
                                          ,0x76);
                            iVar3 = 0x7d;
                            iVar2 = 10;
                          }
                        }
                      }
                      else {
                        curl_mfprintf(_stderr,
                                      "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1502.c"
                                      ,0x72);
                        iVar3 = 0x7d;
                      }
                    }
                  }
                  if (iVar2 != 0) {
                    if (iVar2 != 10) goto LAB_001024ba;
                    break;
                  }
                } while (local_278 != 0);
              }
            }
            else {
              curl_mfprintf(_stderr,
                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1502.c"
                            ,0x5d);
              iVar3 = 0x7d;
            }
          }
        }
      }
    }
    curl_multi_remove_handle(lVar8,lVar7);
    curl_multi_cleanup(lVar8);
    curl_easy_cleanup(lVar7);
    curl_global_cleanup();
  }
  curl_slist_free_all(lVar4);
LAB_001024ba:
  return iVar3;
}

Assistant:

int test(char *URL)
{
  CURL *easy = NULL;
  CURL *dup;
  CURLM *multi = NULL;
  int still_running;
  int res = 0;

  char redirect[160];

  /* DNS cache injection */
  struct curl_slist *dns_cache_list;

  snprintf(redirect, sizeof(redirect), "google.com:%s:%s", libtest_arg2,
           libtest_arg3);

  start_test_timing();

  dns_cache_list = curl_slist_append(NULL, redirect);
  if(!dns_cache_list) {
    fprintf(stderr, "curl_slist_append() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    curl_slist_free_all(dns_cache_list);
    return res;
  }

  easy_init(easy);

  easy_setopt(easy, CURLOPT_URL, URL);
  easy_setopt(easy, CURLOPT_HEADER, 1L);
  easy_setopt(easy, CURLOPT_RESOLVE, dns_cache_list);

  dup = curl_easy_duphandle(easy);
  if(dup) {
    curl_easy_cleanup(easy);
    easy = dup;
  }
  else {
    curl_slist_free_all(dns_cache_list);
    curl_easy_cleanup(easy);
    return CURLE_OUT_OF_MEMORY;
  }

  multi_init(multi);

  multi_add_handle(multi, easy);

  multi_perform(multi, &still_running);

  abort_on_test_timeout();

  while(still_running) {
    struct timeval timeout;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -99;

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);
    timeout.tv_sec = 1;
    timeout.tv_usec = 0;

    multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();

    multi_perform(multi, &still_running);

    abort_on_test_timeout();
  }

test_cleanup:

#ifdef LIB1502
  /* undocumented cleanup sequence - type UA */
  curl_multi_cleanup(multi);
  curl_easy_cleanup(easy);
  curl_global_cleanup();
#endif

#ifdef LIB1503
  /* proper cleanup sequence - type PA */
  curl_multi_remove_handle(multi, easy);
  curl_multi_cleanup(multi);
  curl_easy_cleanup(easy);
  curl_global_cleanup();
#endif

#ifdef LIB1504
  /* undocumented cleanup sequence - type UB */
  curl_easy_cleanup(easy);
  curl_multi_cleanup(multi);
  curl_global_cleanup();
#endif

#ifdef LIB1505
  /* proper cleanup sequence - type PB */
  curl_multi_remove_handle(multi, easy);
  curl_easy_cleanup(easy);
  curl_multi_cleanup(multi);
  curl_global_cleanup();
#endif

  curl_slist_free_all(dns_cache_list);

  return res;
}